

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_buffer(REF_DBL *metric,REF_GRID ref_grid)

{
  REF_MPI ref_mpi;
  REF_NODE pRVar1;
  REF_DBL *pRVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  undefined8 uVar8;
  char *pcVar9;
  double dVar10;
  double dVar11;
  REF_DBL xmax;
  REF_DBL rmax;
  double local_b8;
  REF_DBL r;
  REF_DBL local_a8;
  REF_DBL x;
  undefined1 local_98 [16];
  double local_88;
  
  ref_mpi = ref_grid->mpi;
  pRVar1 = ref_grid->node;
  xmax = -1e-100;
  rmax = 0.0;
  uVar6 = 0;
  uVar5 = (ulong)(uint)pRVar1->max;
  if (pRVar1->max < 1) {
    uVar5 = uVar6;
  }
  r = 0.0;
  local_b8 = -1e-100;
  lVar7 = 0x10;
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    if (-1 < pRVar1->global[uVar6]) {
      pRVar2 = pRVar1->real;
      dVar10 = *(double *)((long)pRVar2 + lVar7 + -0x10);
      dVar11 = *(double *)((long)pRVar2 + lVar7 + -8);
      if (local_b8 <= dVar10) {
        local_b8 = dVar10;
      }
      dVar10 = SQRT(*(double *)((long)pRVar2 + lVar7) * *(double *)((long)pRVar2 + lVar7) +
                    dVar10 * dVar10 + dVar11 * dVar11);
      xmax = local_b8;
      rmax = r;
      if (r <= dVar10) {
        r = dVar10;
        rmax = dVar10;
      }
    }
    lVar7 = lVar7 + 0x78;
  }
  uVar4 = ref_mpi_max(ref_mpi,&r,&rmax,3);
  if (uVar4 == 0) {
    uVar4 = ref_mpi_bcast(ref_mpi,&rmax,1,3);
    if (uVar4 == 0) {
      x = local_b8;
      uVar4 = ref_mpi_max(ref_mpi,&x,&xmax,3);
      if (uVar4 == 0) {
        uVar4 = ref_mpi_bcast(ref_mpi,&xmax,1,3);
        if (uVar4 == 0) {
          lVar7 = 2;
          local_b8 = 0.0;
          do {
            if ((long)ref_grid->node->max <= (long)local_b8) {
              return 0;
            }
            if (-1 < ref_grid->node->global[(long)local_b8]) {
              uVar4 = ref_matrix_diag_m(metric,(REF_DBL *)local_98);
              if (uVar4 != 0) {
                pcVar9 = "eigen decomp";
                uVar8 = 0x881;
LAB_001a10ac:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,uVar8,"ref_metric_buffer",(ulong)uVar4,pcVar9);
                return uVar4;
              }
              pRVar2 = pRVar1->real;
              r = SQRT(pRVar2[lVar7] * pRVar2[lVar7] +
                       pRVar2[lVar7 + -2] * pRVar2[lVar7 + -2] +
                       pRVar2[lVar7 + -1] * pRVar2[lVar7 + -1]);
              dVar10 = 1.0;
              if (r / xmax <= 1.0) {
                dVar10 = r / xmax;
              }
              dVar11 = dVar10 + dVar10;
              if (1.0 <= dVar11) {
                dVar11 = 1.0;
              }
              dVar11 = (1.0 - dVar11) * -15.0 + dVar11 * -4.0;
              if ((0.5 < dVar10) && (dVar10 < 0.9)) {
                dVar11 = (dVar10 + -0.5) / 0.4;
                dVar11 = (1.0 - dVar11) * -4.0 - dVar11;
              }
              local_a8 = rmax;
              dVar11 = pow(10.0,(double)(~-(ulong)(dVar10 < 0.9) & 0xbff0000000000000 |
                                        (ulong)dVar11 & -(ulong)(dVar10 < 0.9)));
              dVar11 = dVar11 * local_a8;
              dVar10 = dVar11 * 1e+20 * dVar11;
              if (dVar10 <= -dVar10) {
                dVar10 = -dVar10;
              }
              if (1.0 < dVar10) {
                dVar10 = 1.0 / (dVar11 * dVar11);
                auVar3._8_8_ = dVar10;
                auVar3._0_8_ = dVar10;
                local_98 = minpd(local_98,auVar3);
                if (dVar10 <= local_88) {
                  local_88 = dVar10;
                }
              }
              uVar4 = ref_matrix_form_m((REF_DBL *)local_98,metric);
              if (uVar4 != 0) {
                pcVar9 = "reform m";
                uVar8 = 0x8a3;
                goto LAB_001a10ac;
              }
            }
            local_b8 = (double)((long)local_b8 + 1);
            lVar7 = lVar7 + 0xf;
            metric = metric + 6;
          } while( true );
        }
        pcVar9 = "bcast";
        uVar8 = 0x87e;
      }
      else {
        pcVar9 = "mpi max";
        uVar8 = 0x87d;
      }
    }
    else {
      pcVar9 = "bcast";
      uVar8 = 0x87b;
    }
  }
  else {
    pcVar9 = "mpi max";
    uVar8 = 0x87a;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar8,
         "ref_metric_buffer",(ulong)uVar4,pcVar9);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_metric_buffer(REF_DBL *metric, REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL diag_system[12];
  REF_DBL eig;
  REF_INT node;
  REF_DBL r, rmax, x, xmax, exponent, hmin, s, t, smin, smax, emin, emax;

  xmax = -1.0e-100;
  rmax = 0.0;
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    r = sqrt(ref_node_xyz(ref_node, 0, node) * ref_node_xyz(ref_node, 0, node) +
             ref_node_xyz(ref_node, 1, node) * ref_node_xyz(ref_node, 1, node) +
             ref_node_xyz(ref_node, 2, node) * ref_node_xyz(ref_node, 2, node));
    rmax = MAX(rmax, r);
    xmax = MAX(xmax, ref_node_xyz(ref_node, 0, node));
  }
  r = rmax;
  RSS(ref_mpi_max(ref_mpi, &r, &rmax, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &rmax, 1, REF_DBL_TYPE), "bcast");
  x = xmax;
  RSS(ref_mpi_max(ref_mpi, &x, &xmax, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &xmax, 1, REF_DBL_TYPE), "bcast");

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "eigen decomp");

    r = sqrt(ref_node_xyz(ref_node, 0, node) * ref_node_xyz(ref_node, 0, node) +
             ref_node_xyz(ref_node, 1, node) * ref_node_xyz(ref_node, 1, node) +
             ref_node_xyz(ref_node, 2, node) * ref_node_xyz(ref_node, 2, node));

    smin = 0.5;
    smax = 0.9;
    emin = -4.0;
    emax = -1.0;

    s = MIN(1.0, r / xmax);

    t = MIN(s / smin, 1.0);
    exponent = -15.0 * (1.0 - t) + emin * t;

    if (smin < s && s < smax) {
      t = (s - smin) / (smax - smin);
      exponent = (emin) * (1.0 - t) + (emax) * (t);
    }

    if (smax <= s) {
      exponent = emax;
    }

    hmin = rmax * pow(10.0, exponent);

    if (ref_math_divisible(1.0, hmin * hmin)) {
      eig = 1.0 / (hmin * hmin);
      ref_matrix_eig(diag_system, 0) = MIN(ref_matrix_eig(diag_system, 0), eig);
      ref_matrix_eig(diag_system, 1) = MIN(ref_matrix_eig(diag_system, 1), eig);
      ref_matrix_eig(diag_system, 2) = MIN(ref_matrix_eig(diag_system, 2), eig);
    }

    RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform m");
  }
  return REF_SUCCESS;
}